

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::CalcListClipping
               (int items_count,float items_height,int *out_items_display_start,
               int *out_items_display_end)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  undefined1 auVar3 [16];
  int iVar4;
  ImGuiContext *g;
  int iVar5;
  int iVar6;
  int iVar7;
  bool *pbVar8;
  float fVar9;
  undefined1 auVar10 [64];
  float fVar11;
  
  if (GImGui->LogEnabled == true) {
    *out_items_display_start = 0;
    goto LAB_0014ac60;
  }
  pIVar2 = GImGui->CurrentWindow;
  pbVar8 = &GImGui->CurrentTable->HostSkipItems;
  if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
    pbVar8 = &pIVar2->SkipItems;
  }
  if (*pbVar8 == true) {
    *out_items_display_end = 0;
    *out_items_display_start = 0;
    return;
  }
  fVar9 = (pIVar2->ClipRect).Min.y;
  auVar10 = ZEXT464((uint)fVar9);
  fVar11 = (pIVar2->ClipRect).Max.y;
  if (GImGui->NavMoveRequest == true) {
    fVar1 = (GImGui->NavScoringRect).Max.y;
    auVar3 = vminss_avx(ZEXT416((uint)(GImGui->NavScoringRect).Min.y),ZEXT416((uint)fVar9));
    auVar10 = ZEXT1664(auVar3);
    if (fVar1 <= fVar11) goto LAB_0014abbb;
  }
  else {
LAB_0014abbb:
    fVar1 = fVar11;
  }
  if ((GImGui->NavJustMovedToId == 0) || (pIVar2->NavLastIds[0] != GImGui->NavJustMovedToId)) {
LAB_0014abf3:
    fVar9 = auVar10._0_4_;
    fVar11 = fVar1;
  }
  else {
    fVar9 = (pIVar2->Pos).y;
    fVar11 = fVar9 + pIVar2->NavRectRel[0].Max.y;
    auVar3 = vminss_avx(ZEXT416((uint)(fVar9 + pIVar2->NavRectRel[0].Min.y)),auVar10._0_16_);
    auVar10 = ZEXT1664(auVar3);
    fVar9 = auVar3._0_4_;
    if (fVar11 <= fVar1) goto LAB_0014abf3;
  }
  fVar1 = (pIVar2->DC).CursorPos.y;
  iVar7 = (int)((fVar9 - fVar1) / items_height);
  iVar5 = (int)((fVar11 - fVar1) / items_height);
  if (GImGui->NavMoveRequest != false) {
    iVar7 = iVar7 - (uint)(GImGui->NavMoveClipDir == 2);
    iVar5 = iVar5 + (uint)(GImGui->NavMoveClipDir == 3);
  }
  iVar4 = items_count;
  if (iVar7 < items_count) {
    iVar4 = iVar7;
  }
  iVar6 = 0;
  if (-1 < iVar7) {
    iVar6 = iVar4;
  }
  iVar5 = iVar5 + 1;
  if (iVar5 < items_count) {
    items_count = iVar5;
  }
  if (iVar5 < iVar6) {
    items_count = iVar6;
  }
  *out_items_display_start = iVar6;
LAB_0014ac60:
  *out_items_display_end = items_count;
  return;
}

Assistant:

void ImGui::CalcListClipping(int items_count, float items_height, int* out_items_display_start, int* out_items_display_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.LogEnabled)
    {
        // If logging is active, do not perform any clipping
        *out_items_display_start = 0;
        *out_items_display_end = items_count;
        return;
    }
    if (GetSkipItemForListClipping())
    {
        *out_items_display_start = *out_items_display_end = 0;
        return;
    }

    // We create the union of the ClipRect and the NavScoringRect which at worst should be 1 page away from ClipRect
    ImRect unclipped_rect = window->ClipRect;
    if (g.NavMoveRequest)
        unclipped_rect.Add(g.NavScoringRect);
    if (g.NavJustMovedToId && window->NavLastIds[0] == g.NavJustMovedToId)
        unclipped_rect.Add(ImRect(window->Pos + window->NavRectRel[0].Min, window->Pos + window->NavRectRel[0].Max));

    const ImVec2 pos = window->DC.CursorPos;
    int start = (int)((unclipped_rect.Min.y - pos.y) / items_height);
    int end = (int)((unclipped_rect.Max.y - pos.y) / items_height);

    // When performing a navigation request, ensure we have one item extra in the direction we are moving to
    if (g.NavMoveRequest && g.NavMoveClipDir == ImGuiDir_Up)
        start--;
    if (g.NavMoveRequest && g.NavMoveClipDir == ImGuiDir_Down)
        end++;

    start = ImClamp(start, 0, items_count);
    end = ImClamp(end + 1, start, items_count);
    *out_items_display_start = start;
    *out_items_display_end = end;
}